

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_buffer.cpp
# Opt level: O3

int __thiscall libtorrent::aux::packet_buffer::remove(packet_buffer *this,char *__filename)

{
  int *piVar1;
  long lVar2;
  _Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
  _Var3;
  void *__ptr;
  uint uVar4;
  bool bVar5;
  ulong uVar6;
  uint32_t uVar7;
  uint uVar8;
  uint uVar9;
  uint32_t in_EDX;
  int iVar10;
  uint uVar11;
  int iVar12;
  
  if ((*(int *)(__filename + 8) + *(uint32_t *)(__filename + 0x10) <= in_EDX) ||
     (bVar5 = compare_less_wrap(in_EDX,*(uint32_t *)(__filename + 0x10),0xffff), bVar5)) {
    (this->m_storage).
    super_unique_ptr<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[],_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
    ._M_t.
    super___uniq_ptr_impl<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>,_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
    .
    super__Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
         = (_Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
            )0x0;
    goto LAB_00235a93;
  }
  uVar11 = *(int *)(__filename + 8) - 1;
  uVar6 = (ulong)(uVar11 & in_EDX);
  lVar2 = *(long *)__filename;
  _Var3._M_head_impl =
       ((_Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
         *)(lVar2 + uVar6 * 8))->_M_head_impl;
  (this->m_storage).
  super_unique_ptr<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[],_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
  ._M_t.
  super___uniq_ptr_impl<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>,_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_std::default_delete<std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>[]>_>
  .
  super__Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
       = (_Head_base<0UL,_std::unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter>_*,_false>
          )_Var3._M_head_impl;
  *(undefined8 *)(lVar2 + uVar6 * 8) = 0;
  __ptr = *(void **)(*(long *)__filename + uVar6 * 8);
  *(undefined8 *)(*(long *)__filename + uVar6 * 8) = 0;
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  if (_Var3._M_head_impl ==
      (unique_ptr<libtorrent::aux::packet,_libtorrent::aux::packet_deleter> *)0x0) {
    uVar7 = *(uint32_t *)(__filename + 0x10);
    bVar5 = *(int *)(__filename + 0xc) == 0;
LAB_00235aee:
    if (uVar7 == in_EDX && !bVar5) {
      iVar10 = *(int *)(__filename + 8);
      uVar8 = in_EDX + 1;
      uVar9 = uVar8;
      if (iVar10 != 0) {
        iVar12 = iVar10 + in_EDX;
        do {
          uVar9 = uVar8;
          if (*(long *)(*(long *)__filename + (ulong)(uVar8 & uVar11) * 8) != 0) break;
          uVar8 = uVar8 + 1;
          iVar10 = iVar10 + -1;
          uVar9 = iVar12 + 1;
        } while (iVar10 != 0);
      }
      *(uint *)(__filename + 0x10) = uVar9 & 0xffff;
    }
  }
  else {
    piVar1 = (int *)(__filename + 0xc);
    *piVar1 = *piVar1 + -1;
    uVar7 = *(uint32_t *)(__filename + 0x10);
    if (*piVar1 != 0) {
      bVar5 = false;
      goto LAB_00235aee;
    }
    *(uint32_t *)(__filename + 0x14) = uVar7;
    bVar5 = true;
  }
  uVar9 = in_EDX + 1 & 0xffff;
  if ((uVar9 == *(uint *)(__filename + 0x14)) && (!bVar5)) {
    iVar10 = *(int *)(__filename + 8);
    if (iVar10 != 0) {
      uVar8 = uVar9 - iVar10;
      do {
        uVar4 = uVar9;
        if (*(long *)(*(long *)__filename + (ulong)(uVar9 - 1 & uVar11) * 8) != 0) break;
        iVar10 = iVar10 + -1;
        uVar9 = uVar9 - 1;
        uVar4 = uVar8;
      } while (iVar10 != 0);
      uVar9 = uVar4 & 0xffff;
    }
    *(uint *)(__filename + 0x14) = uVar9;
  }
LAB_00235a93:
  return (int)this;
}

Assistant:

packet_ptr packet_buffer::remove(index_type idx)
	{
		INVARIANT_CHECK;
		// TODO: use compare_less_wrap for this comparison as well
		if (idx >= m_first + m_capacity)
			return packet_ptr();

		if (compare_less_wrap(idx, m_first, 0xffff))
			return packet_ptr();

		std::size_t const mask = m_capacity - 1;
		packet_ptr old_value = std::move(m_storage[idx & mask]);
		m_storage[idx & mask].reset();

		if (old_value)
		{
			--m_size;
			if (m_size == 0) m_last = m_first;
		}

		if (idx == m_first && m_size != 0)
		{
			++m_first;
			for (index_type i = 0; i < m_capacity; ++i, ++m_first)
				if (m_storage[m_first & mask]) break;
			m_first &= 0xffff;
		}

		if (((idx + 1) & 0xffff) == m_last && m_size != 0)
		{
			--m_last;
			for (index_type i = 0; i < m_capacity; ++i, --m_last)
				if (m_storage[m_last & mask]) break;
			++m_last;
			m_last &= 0xffff;
		}

		TORRENT_ASSERT_VAL(m_first <= 0xffff, m_first);
		return old_value;
	}